

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walLockExclusive(Wal *pWal,int lockIdx,int n)

{
  long in_RDI;
  int rc;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  if (*(char *)(in_RDI + 0x3f) == '\0') {
    local_4 = sqlite3OsShmLock((sqlite3_file *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffe0),
                               in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,0);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int walLockExclusive(Wal *pWal, int lockIdx, int n){
  int rc;
  if( pWal->exclusiveMode ) return SQLITE_OK;
  rc = sqlite3OsShmLock(pWal->pDbFd, lockIdx, n,
                        SQLITE_SHM_LOCK | SQLITE_SHM_EXCLUSIVE);
  WALTRACE(("WAL%p: acquire EXCLUSIVE-%s cnt=%d %s\n", pWal,
            walLockName(lockIdx), n, rc ? "failed" : "ok"));
  VVA_ONLY( pWal->lockError = (u8)(rc!=SQLITE_OK && (rc&0xFF)!=SQLITE_BUSY); )
#ifdef SQLITE_USE_SEH
  if( rc==SQLITE_OK ){
    pWal->lockMask |= (((1<<n)-1) << (SQLITE_SHM_NLOCK+lockIdx));
  }
#endif
  return rc;
}